

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_iostream.h
# Opt level: O0

type __thiscall
_ST_PRIVATE::ostream_format_writer<wchar_t,_std::char_traits<wchar_t>_>::write_data<wchar_t>
          (ostream_format_writer<wchar_t,_std::char_traits<wchar_t>_> *this,char *data,size_t size)

{
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  wchar_t *pwVar2;
  undefined1 local_60 [8];
  wchar_buffer wide;
  size_t size_local;
  char *data_local;
  ostream_format_writer<wchar_t,_std::char_traits<wchar_t>_> *this_local;
  
  wide.m_data._40_8_ = size;
  ST::utf8_to_wchar<wchar_t>((type *)local_60,data,size,check_validity);
  pbVar1 = this->m_stream;
  pwVar2 = ST::buffer<wchar_t>::data((type *)local_60);
  ST::buffer<wchar_t>::size((type *)local_60);
  std::wostream::write((wchar_t *)pbVar1,(long)pwVar2);
  ST::buffer<wchar_t>::~buffer((buffer<wchar_t> *)local_60);
  return;
}

Assistant:

typename std::enable_if<std::is_same<write_char_T, wchar_t>::value, void>::type
        write_data(const char *data, size_t size)
        {
            ST::wchar_buffer wide = ST::utf8_to_wchar(data, size);
            m_stream.write(wide.data(), wide.size());
        }